

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide.cpp
# Opt level: O0

void embree::triangle_bounds_func(RTCBoundsFunctionArguments *args)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *pvVar7;
  const_reference pvVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar9;
  ulong *in_RDI;
  float fVar10;
  undefined1 auVar11 [16];
  BBox3fa bounds;
  Mesh *mesh;
  uint geomID;
  void *ptr;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
  *in_stack_fffffffffffffc10;
  undefined8 *puVar12;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  type local_390;
  undefined4 local_384;
  ulong local_380;
  ulong *local_378;
  undefined8 *local_370;
  ulong local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_318;
  undefined8 *local_310;
  ulong local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2a8;
  ulong *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  ulong *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_248;
  undefined1 *local_240;
  ulong *local_238;
  undefined1 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1e0;
  undefined1 local_1d8 [16];
  undefined8 *local_1c8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 local_1a8 [16];
  undefined8 *local_198;
  undefined8 local_178;
  undefined8 uStack_170;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_160;
  ulong *local_158;
  undefined8 *local_150;
  undefined1 local_148 [16];
  undefined8 *local_138;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_130;
  ulong *local_128;
  undefined8 *local_120;
  undefined1 local_118 [16];
  undefined8 *local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_380 = *in_RDI;
  local_384 = (undefined4)local_380;
  local_378 = in_RDI;
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::operator[]((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
                *)meshes,local_380 & 0xffffffff);
  local_390 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
              ::operator*(in_stack_fffffffffffffc10);
  puVar12 = &local_3b8;
  local_240 = &pos_inf;
  local_370 = puVar12;
  local_248 = puVar12;
  local_208 = std::numeric_limits<float>::infinity();
  uVar1 = CONCAT44(local_208,local_208);
  fStack_204 = local_208;
  fStack_200 = local_208;
  fStack_1fc = local_208;
  local_1f4 = local_208;
  *puVar12 = CONCAT44(local_208,local_208);
  puVar12[1] = uVar1;
  local_238 = &local_3a8;
  local_230 = &neg_inf;
  fVar10 = std::numeric_limits<float>::infinity();
  local_228 = -fVar10;
  local_3a8 = CONCAT44(fVar10,fVar10) ^ 0x8000000080000000;
  uStack_3a0 = CONCAT44(fVar10,fVar10) ^ 0x8000000080000000;
  pvVar7 = &local_390->x_;
  fStack_224 = local_228;
  fStack_220 = local_228;
  fStack_21c = local_228;
  local_218 = local_228;
  pvVar8 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&local_390->tris_,(ulong)(uint)local_378[1]);
  local_2e8 = &std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         (pvVar7,(long)pvVar8->v0)->field_0;
  local_2e0 = &local_3b8;
  local_1e0 = &local_2f8;
  auVar11._8_8_ = uStack_3b0;
  auVar11._0_8_ = local_3b8;
  local_88 = *(undefined8 *)local_2e8;
  uStack_80 = *(undefined8 *)((long)local_2e8 + 8);
  local_1d8 = minps(auVar11,(undefined1  [16])*local_2e8);
  local_1c8 = &local_2f8;
  local_2f8 = local_1d8._0_8_;
  uStack_2f0 = local_1d8._8_8_;
  local_298 = &local_2f8;
  local_3b8 = local_1d8._0_8_;
  uStack_3b0 = local_1d8._8_8_;
  local_158 = &local_3a8;
  local_150 = &local_308;
  local_18 = local_3a8;
  uStack_10 = uStack_3a0;
  auVar4._8_8_ = uStack_3a0;
  auVar4._0_8_ = local_3a8;
  local_28 = *(undefined8 *)local_2e8;
  uStack_20 = *(undefined8 *)(local_2e8->m128 + 2);
  local_148 = maxps(auVar4,(undefined1  [16])*(__m128 *)local_2e8);
  local_138 = &local_308;
  local_308 = local_148._0_8_;
  uStack_300 = local_148._8_8_;
  local_2a0 = &local_3a8;
  local_2a8 = &local_308;
  local_3a8 = local_148._0_8_;
  uStack_3a0 = local_148._8_8_;
  pvVar7 = &local_390->x_;
  local_290 = local_2e0;
  local_1f0 = local_2e8;
  local_1e8 = local_2e0;
  local_160 = local_2e8;
  pvVar8 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&local_390->tris_,(ulong)(uint)local_378[1]);
  local_318 = &std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         (pvVar7,(long)pvVar8->v1)->field_0;
  local_310 = &local_3b8;
  local_1b0 = &local_328;
  local_98 = local_3b8;
  uStack_90 = uStack_3b0;
  auVar2._8_8_ = uStack_3b0;
  auVar2._0_8_ = local_3b8;
  local_a8 = *(undefined8 *)local_318;
  uStack_a0 = *(undefined8 *)((long)local_318 + 8);
  local_1a8 = minps(auVar2,(undefined1  [16])*local_318);
  local_198 = &local_328;
  local_328 = local_1a8._0_8_;
  uStack_320 = local_1a8._8_8_;
  local_278 = &local_328;
  local_3b8 = local_1a8._0_8_;
  uStack_3b0 = local_1a8._8_8_;
  local_128 = &local_3a8;
  local_120 = &local_338;
  local_38 = local_3a8;
  uStack_30 = uStack_3a0;
  auVar5._8_8_ = uStack_3a0;
  auVar5._0_8_ = local_3a8;
  local_48 = *(undefined8 *)local_318;
  uStack_40 = *(undefined8 *)(local_318->m128 + 2);
  local_118 = maxps(auVar5,(undefined1  [16])*(__m128 *)local_318);
  local_108 = &local_338;
  local_338 = local_118._0_8_;
  uStack_330 = local_118._8_8_;
  local_280 = &local_3a8;
  local_288 = &local_338;
  local_3a8 = local_118._0_8_;
  uStack_3a0 = local_118._8_8_;
  pvVar7 = &local_390->x_;
  local_270 = local_310;
  local_1c0 = local_318;
  local_1b8 = local_310;
  local_130 = local_318;
  pvVar8 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                     (&local_390->tris_,(ulong)(uint)local_378[1]);
  paVar9 = &std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                      (pvVar7,(long)pvVar8->v2)->field_0;
  auVar3._8_8_ = uStack_3b0;
  auVar3._0_8_ = local_3b8;
  auVar11 = minps(auVar3,(undefined1  [16])*paVar9);
  local_178 = auVar11._0_8_;
  uStack_170 = auVar11._8_8_;
  auVar6._8_8_ = uStack_3a0;
  auVar6._0_8_ = local_3a8;
  auVar11 = maxps(auVar6,(undefined1  [16])*paVar9);
  local_e8 = auVar11._0_8_;
  uStack_e0 = auVar11._8_8_;
  puVar12 = (undefined8 *)local_378[2];
  *puVar12 = local_178;
  puVar12[1] = uStack_170;
  puVar12[2] = local_e8;
  puVar12[3] = uStack_e0;
  return;
}

Assistant:

void triangle_bounds_func(const struct RTCBoundsFunctionArguments* args)
{
  void* ptr  = args->geometryUserPtr;
  unsigned geomID = (unsigned) (size_t) ptr;
  auto const & mesh = *meshes[geomID];
  BBox3fa bounds = empty;
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v0]);
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v1]);
  bounds.extend(mesh.x_[mesh.tris_[args->primID].v2]);
  *(BBox3fa*) args->bounds_o = bounds;
}